

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O0

int __thiscall
glslang::TScanContext::nonreservedKeyword(TScanContext *this,int esVersion,int nonEsVersion)

{
  bool bVar1;
  int nonEsVersion_local;
  int esVersion_local;
  TScanContext *this_local;
  
  bVar1 = TParseVersions::isEsProfile(&this->parseContext->super_TParseVersions);
  if (((bVar1) && ((this->parseContext->super_TParseVersions).version < esVersion)) ||
     ((bVar1 = TParseVersions::isEsProfile(&this->parseContext->super_TParseVersions), !bVar1 &&
      ((this->parseContext->super_TParseVersions).version < nonEsVersion)))) {
    bVar1 = TParseVersions::isForwardCompatible(&this->parseContext->super_TParseVersions);
    if (bVar1) {
      (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2e])
                (this->parseContext,&this->loc,"using future keyword",this->tokenText,"");
    }
    this_local._4_4_ = identifierOrType(this);
  }
  else {
    this_local._4_4_ = this->keyword;
  }
  return this_local._4_4_;
}

Assistant:

int TScanContext::nonreservedKeyword(int esVersion, int nonEsVersion)
{
    if ((parseContext.isEsProfile() && parseContext.version < esVersion) ||
        (!parseContext.isEsProfile() && parseContext.version < nonEsVersion)) {
        if (parseContext.isForwardCompatible())
            parseContext.warn(loc, "using future keyword", tokenText, "");

        return identifierOrType();
    }

    return keyword;
}